

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareSourceTexture
          (SmokeTest *this,size_t format_idx,size_t target_idx,GLint *out_sizes)

{
  undefined4 uVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar5;
  ulong local_68;
  size_t i;
  Functions *gl;
  GLenum type;
  GLenum target_get_prm;
  GLsizei samples;
  GLenum internal_format;
  GLchar *function_name;
  GLenum format;
  GLenum error;
  _texture_format *texture_format;
  GLint *pGStack_28;
  GLenum target;
  GLint *out_sizes_local;
  size_t target_idx_local;
  size_t format_idx_local;
  SmokeTest *this_local;
  
  gl._4_4_ = *(int *)(texture_targets + target_idx * 0x30 + 0x28);
  lVar5 = format_idx * 0x78;
  _format = texture_formats + lVar5;
  function_name._4_4_ = 0;
  function_name._0_4_ = *(undefined4 *)(texture_formats + lVar5 + 8);
  _samples = "unknown";
  target_get_prm = *(GLenum *)(texture_formats + lVar5 + 4);
  type = 1;
  uVar1 = *(undefined4 *)(texture_formats + lVar5 + 0xc);
  texture_format._4_4_ = gl._4_4_;
  pGStack_28 = out_sizes;
  out_sizes_local = (GLint *)target_idx;
  target_idx_local = format_idx;
  format_idx_local = (size_t)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x868))(0x8d57,&type);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xd91);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_source_tex_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xd95);
  (**(code **)(lVar5 + 0xb8))(texture_format._4_4_,this->m_source_tex_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xd98);
  if (texture_format._4_4_ == 0xde0) {
    (**(code **)(lVar5 + 0x1308))(0xde0,0,target_get_prm,1,0,function_name._0_4_,uVar1,0);
    function_name._4_4_ = (**(code **)(lVar5 + 0x800))();
    _samples = "TexImage1D";
  }
  else if (texture_format._4_4_ == 0xde1) {
LAB_00e19981:
    (**(code **)(lVar5 + 0x1310))
              (texture_format._4_4_,0,target_get_prm,1,1,0,function_name._0_4_,uVar1,0);
    function_name._4_4_ = (**(code **)(lVar5 + 0x800))();
    _samples = "TexImage2D";
  }
  else if (texture_format._4_4_ == 0x806f) {
LAB_00e199dc:
    (**(code **)(lVar5 + 0x1320))
              (texture_format._4_4_,0,target_get_prm,1,1,1,0,function_name._0_4_,uVar1,0);
    function_name._4_4_ = (**(code **)(lVar5 + 0x800))();
    _samples = "TexImage3D";
  }
  else {
    if (texture_format._4_4_ == 0x84f5) goto LAB_00e19981;
    if (texture_format._4_4_ == 0x8513) {
      for (local_68 = 0; local_68 < 6; local_68 = local_68 + 1) {
        (**(code **)(lVar5 + 0x1310))
                  ((&cube_map_faces)[local_68],0,target_get_prm,1,1,0,function_name._0_4_,uVar1,0);
      }
      function_name._4_4_ = (**(code **)(lVar5 + 0x800))();
      _samples = "TexImage2D";
      gl._4_4_ = 0x8516;
    }
    else {
      if (texture_format._4_4_ == 0x8c18) goto LAB_00e19981;
      if (texture_format._4_4_ == 0x8c1a) goto LAB_00e199dc;
      if (texture_format._4_4_ == 0x9100) {
        (**(code **)(lVar5 + 0x1318))(0x9100,type,target_get_prm,1,1,0);
        function_name._4_4_ = (**(code **)(lVar5 + 0x800))();
        _samples = "TexImage2DMultisample";
      }
      else {
        if (texture_format._4_4_ != 0x9102) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                     ,0xdd4);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (**(code **)(lVar5 + 0x1328))(0x9102,type,target_get_prm,1,1,1,0);
        function_name._4_4_ = (**(code **)(lVar5 + 0x800))();
        _samples = "TexImage3DMultisample";
      }
    }
  }
  glu::checkError(function_name._4_4_,_samples,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xdd9);
  if (((texture_format._4_4_ != 0x9100) && (texture_format._4_4_ != 0x9102)) &&
     (texture_format._4_4_ != 0x84f5)) {
    (**(code **)(lVar5 + 0x1360))(texture_format._4_4_,0x813c,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xde0);
    (**(code **)(lVar5 + 0x1360))(texture_format._4_4_,0x813d,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xde3);
    (**(code **)(lVar5 + 0x1360))(texture_format._4_4_,0x2801,0x2600);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xde6);
    (**(code **)(lVar5 + 0x1360))(texture_format._4_4_,0x2800,0x2600);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xde9);
  }
  if (*(int *)(_format + 0x10) == 0x1901) {
    (**(code **)(lVar5 + 0x1360))(texture_format._4_4_,0x90ea,*(undefined4 *)(_format + 0x10));
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xdef);
  }
  if (2 < target_get_prm - 0x81a5) {
    if (target_get_prm != 0x88f0) {
      if (target_get_prm == 0x8cac) goto LAB_00e19dc5;
      if (target_get_prm != 0x8cad) {
        (**(code **)(lVar5 + 0xab0))(gl._4_4_,0,0x805c,pGStack_28);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"GetTexLevelParameteriv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                        ,0xe0a);
        (**(code **)(lVar5 + 0xab0))(gl._4_4_,0,0x805d,pGStack_28 + 1);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"GetTexLevelParameteriv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                        ,0xe0d);
        (**(code **)(lVar5 + 0xab0))(gl._4_4_,0,0x805e,pGStack_28 + 2);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"GetTexLevelParameteriv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                        ,0xe10);
        (**(code **)(lVar5 + 0xab0))(gl._4_4_,0,0x805f,pGStack_28 + 3);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"GetTexLevelParameteriv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                        ,0xe13);
        goto LAB_00e19f11;
      }
    }
    (**(code **)(lVar5 + 0xab0))(gl._4_4_,0,0x88f1,pGStack_28 + 1);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"GetTexLevelParameteriv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xdf9);
  }
LAB_00e19dc5:
  (**(code **)(lVar5 + 0xab0))(gl._4_4_,0,0x884a,pGStack_28);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"GetTexLevelParameteriv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xe03);
LAB_00e19f11:
  (**(code **)(lVar5 + 0xb8))(texture_format._4_4_,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xe1a);
  return;
}

Assistant:

void SmokeTest::prepareSourceTexture(size_t format_idx, size_t target_idx, glw::GLint out_sizes[4])
{
	static const glw::GLint border = 0;
	static const glw::GLint level  = 0;

	/* */
	const glw::GLenum	  target		  = texture_targets[target_idx].m_target;
	const _texture_format& texture_format = texture_formats[format_idx];

	/* */
	glw::GLenum		   error		   = 0;
	const glw::GLenum  format		   = texture_format.m_format;
	const glw::GLchar* function_name   = "unknown";
	const glw::GLenum  internal_format = texture_format.m_internal_format;
	glw::GLsizei	   samples		   = 1;
	glw::GLenum		   target_get_prm  = target;
	const glw::GLenum  type			   = texture_format.m_type;

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get max number of samples */
	gl.getIntegerv(GL_MAX_SAMPLES, &samples);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Generate and bind */
	gl.genTextures(1, &m_source_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	gl.bindTexture(target, m_source_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Allocate storage */
	switch (target)
	{
	case GL_TEXTURE_1D:

		gl.texImage1D(target, level, internal_format, m_width, border, format, type, 0 /* pixels */);
		error		  = gl.getError();
		function_name = "TexImage1D";

		break;

	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.texImage2D(target, level, internal_format, m_width, m_height, border, format, type, 0 /* pixels */);
		error		  = gl.getError();
		function_name = "TexImage2D";

		break;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
		gl.texImage3D(target, level, internal_format, m_width, m_height, m_depth, border, format, type, 0 /* pixels */);
		error		  = gl.getError();
		function_name = "TexImage3D";

		break;

	case GL_TEXTURE_CUBE_MAP:
		for (size_t i = 0; i < n_cube_map_faces; ++i)
		{
			gl.texImage2D(cube_map_faces[i], level, internal_format, m_width, m_height, border, format, type,
						  0 /* pixels */);
		}
		error		  = gl.getError();
		function_name = "TexImage2D";

		target_get_prm = cube_map_faces[0];

		break;

	case GL_TEXTURE_2D_MULTISAMPLE:
		gl.texImage2DMultisample(target, samples, internal_format, m_width, m_height,
								 GL_FALSE /* fixedsamplelocation */);
		error		  = gl.getError();
		function_name = "TexImage2DMultisample";

		break;

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		gl.texImage3DMultisample(target, samples, internal_format, m_width, m_height, m_depth,
								 GL_FALSE /* fixedsamplelocation */);
		error		  = gl.getError();
		function_name = "TexImage3DMultisample";

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Log error */
	GLU_EXPECT_NO_ERROR(error, function_name);

	/* Make texture complete and set ds texture mode */
	if ((GL_TEXTURE_2D_MULTISAMPLE != target) && (GL_TEXTURE_2D_MULTISAMPLE_ARRAY != target) &&
		(GL_TEXTURE_RECTANGLE != target))
	{
		gl.texParameteri(target, GL_TEXTURE_BASE_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		gl.texParameteri(target, GL_TEXTURE_MAX_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		gl.texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		gl.texParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
	}

	if (texture_format.m_ds_mode == GL_STENCIL_INDEX)
	{
		gl.texParameteri(target, GL_DEPTH_STENCIL_TEXTURE_MODE, texture_format.m_ds_mode);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
	}

	/* Get internal storage sizes */
	switch (internal_format)
	{
	case GL_DEPTH24_STENCIL8:
	case GL_DEPTH32F_STENCIL8:

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_STENCIL_SIZE, out_sizes + 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

	/* Fall through */

	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH_COMPONENT32:
	case GL_DEPTH_COMPONENT32F:

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_DEPTH_SIZE, out_sizes + 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

		break;

	default:

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_RED_SIZE, out_sizes + 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_GREEN_SIZE, out_sizes + 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_BLUE_SIZE, out_sizes + 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_ALPHA_SIZE, out_sizes + 3);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

		break;
	}

	/* Unbind texture */
	gl.bindTexture(target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}